

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

void yyPush(GREG *G,char *text,int count,yythunk *thunk,void *yyxvar)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = ((long)G->val - (long)G->vals >> 2) + (long)count;
  iVar1 = G->valslen;
  uVar3 = (ulong)iVar1;
  if (uVar3 < uVar4) {
    if (uVar3 < uVar4 + 1) {
      do {
        iVar1 = iVar1 * 2;
        uVar3 = (ulong)iVar1;
      } while (uVar3 < uVar4 + 1);
      G->valslen = iVar1;
    }
    piVar2 = (int *)realloc(G->vals,uVar3 << 2);
    G->vals = piVar2;
    piVar2 = piVar2 + uVar4;
  }
  else {
    piVar2 = G->val + count;
  }
  G->val = piVar2;
  return;
}

Assistant:

YY_LOCAL(void) yyPush(GREG *G, char *text, int count, yythunk *thunk, YY_XTYPE YY_XVAR)	{
  size_t off = (G->val - G->vals) + count;
  if (off > G->valslen) {
    while (G->valslen < off + 1)
      G->valslen *= 2;
    G->vals= (YYSTYPE*)YY_REALLOC((void *)G->vals, sizeof(YYSTYPE) * G->valslen, G->data);
    G->val= G->vals + off;
  } else {
    G->val += count;
  }
}